

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::StaleFileRemovalCommand::getShortDescription
          (StaleFileRemovalCommand *this,SmallVectorImpl<char> *result)

{
  size_type sVar1;
  pointer pcVar2;
  size_t in_RCX;
  long *local_58;
  void *local_50;
  long local_48 [2];
  raw_ostream local_38;
  SmallVectorImpl<char> *local_10;
  
  local_38.BufferMode = InternalBuffer;
  local_38.OutBufStart = (char *)0x0;
  local_38.OutBufEnd = (char *)0x0;
  local_38.OutBufCur = (char *)0x0;
  local_38._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00251be0;
  local_10 = result;
  llvm::raw_ostream::SetUnbuffered(&local_38);
  sVar1 = (this->description)._M_string_length;
  local_58 = local_48;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Stale file removal","");
  }
  else {
    pcVar2 = (this->description)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar2,pcVar2 + sVar1);
  }
  llvm::raw_ostream::write(&local_38,(int)local_58,local_50,in_RCX);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  llvm::raw_ostream::~raw_ostream(&local_38);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << (description.empty() ? "Stale file removal" : description);
  }